

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_encoder.hpp
# Opt level: O1

bool __thiscall
jsoncons::
basic_compact_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>
::visit_null(basic_compact_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>
             *this,semantic_tag param_1,ser_context *param_2,error_code *param_3)

{
  size_t *psVar1;
  pointer peVar2;
  container_type *pcVar3;
  
  peVar2 = (this->stack_).
           super__Vector_base<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>::encoding_context>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((((this->stack_).
        super__Vector_base<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>::encoding_context>_>
        ._M_impl.super__Vector_impl_data._M_start != peVar2) && (peVar2[-1].type_ == array)) &&
     (peVar2[-1].count_ != 0)) {
    std::__cxx11::wstring::push_back((wchar_t)(this->sink_).buf_ptr);
  }
  pcVar3 = (this->sink_).buf_ptr;
  std::__cxx11::wstring::replace((ulong)pcVar3,pcVar3->_M_string_length,(wchar_t *)0x0,0x87772c);
  peVar2 = (this->stack_).
           super__Vector_base<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>::encoding_context>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->stack_).
      super__Vector_base<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>::encoding_context>_>
      ._M_impl.super__Vector_impl_data._M_start != peVar2) {
    psVar1 = &peVar2[-1].count_;
    *psVar1 = *psVar1 + 1;
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_null(semantic_tag, const ser_context&, std::error_code&) final
        {
            if (!stack_.empty() && stack_.back().is_array() && stack_.back().count() > 0)
            {
                sink_.push_back(',');
            }

            sink_.append(null_constant().data(), null_constant().size());

            if (!stack_.empty())
            {
                stack_.back().increment_count();
            }
            JSONCONS_VISITOR_RETURN;
        }